

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
Pass2thread::Pass2thread(Pass2thread *this,client_socket *_client,string *log_file,int _idx)

{
  C_std::Network::client_socket::client_socket(&this->client,_client);
  Log::Log(&this->log,log_file);
  this->idx = _idx;
  return;
}

Assistant:

Pass2thread(C_std::Network::client_socket _client, const string &log_file, int _idx)
            : client(_client)
            , log(log_file)
            , idx(_idx)
    {}